

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O3

Instr * __thiscall
Inline::InlineApplyWithArgumentsObject
          (Inline *this,Instr *callInstr,Instr *argsObjectArgInstr,FunctionJITTimeInfo *funcInfo)

{
  Func *pFVar1;
  _func_int **pp_Var2;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  uint uVar6;
  StackSym *pSVar7;
  undefined4 *puVar8;
  BailOutInstrTemplate<IR::Instr> *instr;
  BailOutInfo *bailOutInfo;
  Opnd *pOVar9;
  ByteCodeUsesInstr *this_00;
  Instr *pIVar10;
  RegOpnd *newDst;
  IntConstOpnd *this_01;
  SymOpnd *dstOpnd;
  SymOpnd *newSrc;
  uint uVar11;
  Instr *insertInstr;
  Inline *this_02;
  Instr *pIVar12;
  byte bVar13;
  Instr *local_88;
  Instr *builtInStartInstr;
  Instr *pIStack_78;
  uint argOutCount;
  Instr *implicitThisArgOut;
  Instr *argumentsObjArgOut;
  StackSym *local_60;
  Instr *local_58;
  Instr *local_50;
  Instr *explicitThisArgOut;
  Instr *local_40;
  bool local_31 [8];
  bool safeThis;
  
  argumentsObjArgOut = callInstr->m_next;
  pSVar7 = IR::Opnd::GetStackSym(argsObjectArgInstr->m_src1);
  explicitThisArgOut = (Instr *)0x0;
  if ((pSVar7->field_0x18 & 1) != 0) {
    explicitThisArgOut = (pSVar7->field_5).m_instrDef;
  }
  IR::Instr::ReplaceSrc1(argsObjectArgInstr,explicitThisArgOut->m_dst);
  pIStack_78 = (Instr *)0x0;
  local_50 = (Instr *)0x0;
  implicitThisArgOut = (Instr *)0x0;
  builtInStartInstr._4_4_ = 0;
  GetArgInstrsForCallAndApply
            ((Inline *)argsObjectArgInstr,callInstr,&stack0xffffffffffffff88,&local_50,
             &implicitThisArgOut,(uint *)((long)&builtInStartInstr + 4));
  pIVar10 = pIStack_78;
  if (pIStack_78 == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xa13,"(implicitThisArgOut)","implicitThisArgOut");
    if (!bVar4) goto LAB_00551368;
    *puVar8 = 0;
  }
  if (local_50 == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xa14,"(explicitThisArgOut)","explicitThisArgOut");
    if (!bVar4) goto LAB_00551368;
    *puVar8 = 0;
  }
  if (implicitThisArgOut == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xa15,"(argumentsObjArgOut)","argumentsObjArgOut");
    if (!bVar4) goto LAB_00551368;
    *puVar8 = 0;
  }
  local_60 = IR::Opnd::GetStackSym(callInstr->m_src1);
  local_40 = (Instr *)CONCAT71(local_40._1_7_,callInstr->m_src1->field_0xb);
  local_31[0] = false;
  this_02 = this;
  bVar4 = TryOptimizeCallInstrWithFixedMethod
                    (this,callInstr,funcInfo,false,true,false,true,local_31,false,0);
  if (bVar4) {
    if (callInstr->m_opcode != CallIFixed) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0xa2a,"(callInstr->m_opcode == Js::OpCode::CallIFixed)",
                         "callInstr->m_opcode == Js::OpCode::CallIFixed");
      if (!bVar4) goto LAB_00551368;
      *puVar8 = 0;
    }
    instr = IR::BailOutInstrTemplate<IR::Instr>::New
                      (BailOnNotStackArgs,BailOutOnInlineFunction,callInstr,callInstr->m_func);
  }
  else {
    pIVar10 = PrepareInsertionPoint(this_02,callInstr,funcInfo,pIVar10);
    bailOutInfo = IR::Instr::GetBailOutInfo(pIVar10);
    instr = IR::BailOutInstrTemplate<IR::Instr>::New
                      (BailOnNotStackArgs,BailOutOnInlineFunction,bailOutInfo,callInstr->m_func);
  }
  pOVar9 = IR::Opnd::Copy(explicitThisArgOut->m_dst,this->topFunc);
  if ((instr->super_Instr).m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar4) goto LAB_00551368;
    *puVar8 = 0;
  }
  pFVar1 = (instr->super_Instr).m_func;
  if (pOVar9->isDeleted == true) {
    AssertCount = AssertCount + 1;
    local_58 = pIVar10;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar4) goto LAB_00551368;
    *puVar8 = 0;
    pIVar10 = local_58;
  }
  bVar13 = pOVar9->field_0xb;
  if ((bVar13 & 2) != 0) {
    pOVar9 = IR::Opnd::Copy(pOVar9,pFVar1);
    bVar13 = pOVar9->field_0xb;
  }
  pOVar9->field_0xb = bVar13 | 2;
  (instr->super_Instr).m_src1 = pOVar9;
  IR::Instr::InsertBefore(pIVar10,&instr->super_Instr);
  if (callInstr->m_opcode == CallIFixed) {
    bVar13 = (byte)local_40 & 8;
    this_00 = IR::ByteCodeUsesInstr::New(callInstr);
    IR::ByteCodeUsesInstr::SetRemovedOpndSymbol
              (this_00,(bool)(bVar13 >> 3),(local_60->super_Sym).m_id);
    pIVar10 = callInstr;
    IR::Instr::InsertBefore(callInstr,&this_00->super_Instr);
  }
  pIVar10 = InsertInlineeBuiltInStartEndTags((Inline *)pIVar10,callInstr,3,&local_88);
  pIVar10->m_opcode = InlineNonTrackingBuiltInEnd;
  local_40 = local_88;
  pSVar7 = IR::Opnd::GetStackSym(local_88->m_src2);
  pIVar10 = (pSVar7->field_5).m_instrDef;
  if ((pIVar10 != (Instr *)0x0 & pSVar7->field_0x18) == 1) {
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    insertInstr = local_40;
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                       ,0x1af,"(linkSym->IsSingleDef())","linkSym->IsSingleDef()");
    if (!bVar4) goto LAB_00551368;
    *puVar8 = 0;
    pIVar10 = (pSVar7->field_5).m_instrDef;
    insertInstr = local_40;
  }
  do {
    if ((pIVar10->m_src2 == (Opnd *)0x0) ||
       (OVar5 = IR::Opnd::GetKind(pIVar10->m_src2), OVar5 != OpndKindSym)) {
LAB_005510e0:
      pIVar12 = (Instr *)0x0;
    }
    else {
      pOVar9 = pIVar10->m_src2;
      OVar5 = IR::Opnd::GetKind(pOVar9);
      if (OVar5 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar4) goto LAB_00551368;
        *puVar8 = 0;
      }
      pp_Var2 = pOVar9[1]._vptr_Opnd;
      if (*(char *)((long)pp_Var2 + 0x14) != '\x01') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
        if (!bVar4) goto LAB_00551368;
        *puVar8 = 0;
      }
      uVar6 = *(uint *)(pp_Var2 + 3);
      uVar11 = uVar6 & 0x100000;
      if ((uVar11 != 0) && (*(short *)((long)pp_Var2 + 0x16) == 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
        if (!bVar4) goto LAB_00551368;
        *puVar8 = 0;
        uVar6 = *(uint *)(pp_Var2 + 3);
        uVar11 = uVar6 & 0x100000;
      }
      if (uVar11 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1b8,"(linkSym->IsArgSlotSym())","linkSym->IsArgSlotSym()");
        if (!bVar4) goto LAB_00551368;
        *puVar8 = 0;
        uVar6 = *(uint *)(pp_Var2 + 3);
      }
      if (((((uVar6 & 1) == 0) || (pp_Var2[5] == (_func_int *)0x0)) &&
          (bVar4 = Func::IsInPhase(local_40->m_func,FGPeepsPhase), !bVar4)) &&
         (bVar4 = Func::IsInPhase(local_40->m_func,FGBuildPhase), !bVar4)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1bf,
                           "(linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase)))"
                           ,
                           "linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase))"
                          );
        if (!bVar4) goto LAB_00551368;
        *puVar8 = 0;
      }
      if (((ulong)pp_Var2[3] & 1) == 0) goto LAB_005510e0;
      pIVar12 = (Instr *)pp_Var2[5];
    }
    if (pIVar10->m_opcode != ArgOut_A_InlineSpecialized) {
      if (pIVar10->m_opcode == StartCall) {
        if (pIVar12 != (Instr *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                             ,0x1ce,"(nextArg == nullptr)","nextArg == nullptr");
          if (!bVar4) goto LAB_00551368;
          *puVar8 = 0;
        }
        break;
      }
      IR::Instr::Move(pIVar10,insertInstr);
      insertInstr = pIVar10;
    }
    pIVar10 = pIVar12;
  } while (pIVar12 != (Instr *)0x0);
  pIVar10 = IR::Instr::New(StartCall,callInstr->m_func);
  newDst = IR::RegOpnd::New(TyVar,callInstr->m_func);
  IR::Instr::SetDst(pIVar10,&newDst->super_Opnd);
  this_01 = IR::IntConstOpnd::New(2,TyInt32,callInstr->m_func,false);
  if (pIVar10->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar4) goto LAB_00551368;
    *puVar8 = 0;
  }
  pFVar1 = pIVar10->m_func;
  if ((this_01->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar4) {
LAB_00551368:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
  }
  bVar13 = (this_01->super_Opnd).field_0xb;
  if ((bVar13 & 2) != 0) {
    this_01 = (IntConstOpnd *)IR::Opnd::Copy(&this_01->super_Opnd,pFVar1);
    bVar13 = (this_01->super_Opnd).field_0xb;
  }
  (this_01->super_Opnd).field_0xb = bVar13 | 2;
  pIVar10->m_src1 = &this_01->super_Opnd;
  IR::Instr::InsertBefore(callInstr,pIVar10);
  pSVar7 = SymTable::GetArgSlotSym(callInstr->m_func->m_symTable,2);
  dstOpnd = IR::SymOpnd::New(&pSVar7->super_Sym,0,TyVar,callInstr->m_func);
  pSVar7 = SymTable::GetArgSlotSym(callInstr->m_func->m_symTable,1);
  newSrc = IR::SymOpnd::New(&pSVar7->super_Sym,0,TyVar,callInstr->m_func);
  pIVar10 = IR::Instr::New(ArgOut_A_FromStackArgs,&dstOpnd->super_Opnd,explicitThisArgOut->m_dst,
                           pIVar10->m_dst,callInstr->m_func);
  IR::Instr::InsertBefore(callInstr,pIVar10);
  IR::Instr::ReplaceSrc1(callInstr,pIStack_78->m_src1);
  IR::Instr::ReplaceSrc2(callInstr,&newSrc->super_Opnd);
  callInstr->m_opcode = CallIDynamic;
  pIVar10 = IR::Instr::New(ArgOut_A_Dynamic,&newSrc->super_Opnd,local_50->m_src1,
                           &dstOpnd->super_Opnd,callInstr->m_func);
  IR::Instr::InsertBefore(callInstr,pIVar10);
  return argumentsObjArgOut;
}

Assistant:

IR::Instr * Inline::InlineApplyWithArgumentsObject(IR::Instr * callInstr, IR::Instr * argsObjectArgInstr, const FunctionJITTimeInfo * funcInfo)
{
    IR::Instr* instrNext = callInstr->m_next;
    IR::Instr* ldHeapArguments = argsObjectArgInstr->GetSrc1()->GetStackSym()->GetInstrDef();
    argsObjectArgInstr->ReplaceSrc1(ldHeapArguments->GetDst());

    IR::Instr * implicitThisArgOut = nullptr;
    IR::Instr * explicitThisArgOut = nullptr;
    IR::Instr * argumentsObjArgOut = nullptr;
    uint argOutCount = 0;
    this->GetArgInstrsForCallAndApply(callInstr, &implicitThisArgOut, &explicitThisArgOut, &argumentsObjArgOut, argOutCount);

    Assert(implicitThisArgOut);
    Assert(explicitThisArgOut);
    Assert(argumentsObjArgOut);

    //      BailOnNotEqual  s4.var                  ---------------New additional BAILOUT if not stack args or actuals exceed 16 at runtime.
    //      Bailout: #004e (BailOutOnInlineFunction)
    //      linkOpnd      Argout_FromStackArgs s4.var
    //      linkOpnd1     ArgOut_A_Dynamic  s3.var, linkOpnd
    //                    CallI_Dynamic     s6.var,  linkOpnd1

    IR::Instr* bailOutOnNotStackArgs;
    IR::Instr* bailOutOnNotStackArgsInsertionPoint = implicitThisArgOut;

    // Save off the call target operand (function object) so we can extend its lifetime as needed, even if
    // the call instruction gets transformed to CallIFixed.
    StackSym* originalCallTargetStackSym = callInstr->GetSrc1()->GetStackSym();
    bool originalCallTargetOpndIsJITOpt = callInstr->GetSrc1()->GetIsJITOptimizedReg();

    // If we optimized the call instruction for a fixed function we will have bailed out earlier if the function
    // wasn't what we expected or was not a function at all.  However, we must still check and bail out on heap arguments.
    bool safeThis = false;
    if (TryOptimizeCallInstrWithFixedMethod(callInstr, funcInfo, false /*isPolymorphic*/, true /*isBuiltIn*/, false /*isCtor*/, true /*isInlined*/, safeThis /*unused here*/))
    {
        Assert(callInstr->m_opcode == Js::OpCode::CallIFixed);
        bailOutOnNotStackArgs = IR::BailOutInstr::New(Js::OpCode::BailOnNotStackArgs, IR::BailOutOnInlineFunction, callInstr, callInstr->m_func);
    }
    else
    {
        IR::Instr *primaryBailoutInstr = PrepareInsertionPoint(callInstr, funcInfo, implicitThisArgOut);
        bailOutOnNotStackArgs = IR::BailOutInstr::New(Js::OpCode::BailOnNotStackArgs, IR::BailOutOnInlineFunction, primaryBailoutInstr->GetBailOutInfo(), callInstr->m_func);
        bailOutOnNotStackArgsInsertionPoint = primaryBailoutInstr;
    }

    // set src1 to avoid CSE on BailOnNotStackArgs for different arguments object
    bailOutOnNotStackArgs->SetSrc1(ldHeapArguments->GetDst()->Copy(this->topFunc));
    bailOutOnNotStackArgsInsertionPoint->InsertBefore(bailOutOnNotStackArgs);

    // If we optimized the call instruction for a fixed function, we must extend the function object's lifetime until after
    // the bailout on non-stack arguments.
    if (callInstr->m_opcode == Js::OpCode::CallIFixed)
    {
        IR::ByteCodeUsesInstr * useCallTargetInstr = IR::ByteCodeUsesInstr::New(callInstr);
        useCallTargetInstr->SetRemovedOpndSymbol(originalCallTargetOpndIsJITOpt, originalCallTargetStackSym->m_id);
        callInstr->InsertBefore(useCallTargetInstr);
    }

    // Optimize .init.apply(this, arguments);
    IR::Instr* builtInStartInstr;
    IR::Instr *instr = InsertInlineeBuiltInStartEndTags(callInstr, 3, &builtInStartInstr); //3 args (implicit this + explicit this + arguments = 3)
    instr->m_opcode = Js::OpCode::InlineNonTrackingBuiltInEnd;

    // Move argouts close to call. Globopt expects this for arguments object tracking.
    IR::Instr* argInsertInstr = builtInStartInstr;
    builtInStartInstr->IterateArgInstrs([&](IR::Instr* argInstr) {
        argInstr->Move(argInsertInstr);
        argInsertInstr = argInstr;
        return false;
    });

    IR::Instr *startCall = IR::Instr::New(Js::OpCode::StartCall, callInstr->m_func);
    startCall->SetDst(IR::RegOpnd::New(TyVar, callInstr->m_func));
    startCall->SetSrc1(IR::IntConstOpnd::New(2, TyInt32, callInstr->m_func)); //2 args (this pointer & ArgOut_A_From_StackArgs for this direct call to init

    callInstr->InsertBefore(startCall);

    StackSym *symDst = callInstr->m_func->m_symTable->GetArgSlotSym((uint16)(2));
    IR::SymOpnd* linkOpnd1 = IR::SymOpnd::New(symDst, 0, TyVar, callInstr->m_func);

    symDst = callInstr->m_func->m_symTable->GetArgSlotSym((uint16)(1));
    IR::Opnd *linkOpnd2 = IR::SymOpnd::New(symDst, 0, TyVar, callInstr->m_func);

    // This keeps the stack args alive for bailout to recover
    IR::Instr* argout = IR::Instr::New(Js::OpCode::ArgOut_A_FromStackArgs, linkOpnd1, ldHeapArguments->GetDst(), startCall->GetDst(), callInstr->m_func);
    callInstr->InsertBefore(argout);

    callInstr->ReplaceSrc1(implicitThisArgOut->GetSrc1());
    callInstr->ReplaceSrc2(linkOpnd2);
    callInstr->m_opcode = Js::OpCode::CallIDynamic;

    argout = IR::Instr::New(Js::OpCode::ArgOut_A_Dynamic, linkOpnd2, explicitThisArgOut->GetSrc1(), linkOpnd1, callInstr->m_func); // push explicit this as this pointer
    callInstr->InsertBefore(argout);
    return instrNext;
}